

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_primitive_field_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::RepeatedImmutablePrimitiveFieldLiteGenerator::
GenerateSerializationCode(RepeatedImmutablePrimitiveFieldLiteGenerator *this,Printer *printer)

{
  char *text;
  
  text = 
  "for (int i = 0; i < $name$_.size(); i++) {\n  output.write$capitalized_type$($number$, $repeated_get$(i));\n}\n"
  ;
  if (*(char *)(*(long *)(this->descriptor_ + 0x80) + 0x6c) != '\0') {
    text = 
    "if (get$capitalized_name$List().size() > 0) {\n  output.writeUInt32NoTag($tag$);\n  output.writeUInt32NoTag($name$MemoizedSerializedSize);\n}\nfor (int i = 0; i < $name$_.size(); i++) {\n  output.write$capitalized_type$NoTag($repeated_get$(i));\n}\n"
    ;
  }
  io::Printer::Print(printer,&this->variables_,text);
  return;
}

Assistant:

void RepeatedImmutablePrimitiveFieldLiteGenerator::
GenerateSerializationCode(io::Printer* printer) const {
  if (descriptor_->options().packed()) {
    // We invoke getSerializedSize in writeTo for messages that have packed
    // fields in ImmutableMessageGenerator::GenerateMessageSerializationMethods.
    // That makes it safe to rely on the memoized size here.
    printer->Print(variables_,
      "if (get$capitalized_name$List().size() > 0) {\n"
      "  output.writeUInt32NoTag($tag$);\n"
      "  output.writeUInt32NoTag($name$MemoizedSerializedSize);\n"
      "}\n"
      "for (int i = 0; i < $name$_.size(); i++) {\n"
      "  output.write$capitalized_type$NoTag($repeated_get$(i));\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "for (int i = 0; i < $name$_.size(); i++) {\n"
      "  output.write$capitalized_type$($number$, $repeated_get$(i));\n"
      "}\n");
  }
}